

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O0

bool get_tokens_as_string(Lexer *lexer,string *s)

{
  bool bVar1;
  iterator __lhs;
  Token *in_RSI;
  long in_RDI;
  Token *tok;
  iterator __end1;
  iterator __begin1;
  vector<Token,_std::allocator<Token>_> *__range1;
  bool first;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_28;
  long local_20;
  byte local_11;
  
  std::__cxx11::string::reserve((ulong)in_RSI);
  std::__cxx11::string::operator+=((string *)in_RSI,"\"tokens\":[");
  local_11 = 1;
  local_20 = in_RDI + 0x50;
  local_28._M_current =
       (Token *)std::vector<Token,_std::allocator<Token>_>::begin
                          ((vector<Token,_std::allocator<Token>_> *)in_stack_ffffffffffffffc8);
  __lhs = std::vector<Token,_std::allocator<Token>_>::end
                    ((vector<Token,_std::allocator<Token>_> *)in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
         operator*(&local_28);
    if ((local_11 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RSI,",");
    }
    stringify_token(in_RSI);
    std::__cxx11::string::operator+=((string *)in_RSI,"\n{");
    std::__cxx11::string::operator+=((string *)in_RSI,buf);
    std::__cxx11::string::operator+=((string *)in_RSI,"}");
    local_11 = 0;
    if (in_stack_ffffffffffffffc8->type == TK_EOF) break;
    __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
              (&local_28);
  }
  std::__cxx11::string::operator+=((string *)in_RSI,"]");
  return true;
}

Assistant:

bool get_tokens_as_string(Lexer & lexer, string & s)
{
  s.reserve(16384);
  s += "\"tokens\":[";

  bool first = true;
  for (Token & tok : lexer.tokens)
  {
    if (!first)
      s += ",";

    stringify_token(tok);
    s += "\n{";
    s += buf;
    s += "}";
    first = false;

    if (tok.type == TK_EOF)
      break;
  }

  s += "]";
  return true;
}